

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void readDependenciesFromFiles
               (Options *options,QList<QtDependency> *files,QSet<QString> *usedDependencies,
               QSet<QString> *remainingDependencies)

{
  byte bVar1;
  Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *this;
  Entry *pEVar2;
  FILE *pFVar3;
  char cVar4;
  bool bVar5;
  Node<QString,_QHashDummyValue> *pNVar6;
  undefined8 *puVar7;
  long lVar8;
  uchar *this_00;
  QString *key;
  long in_FS_OFFSET;
  QLatin1String QVar9;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = (files->d).size;
  if (lVar8 != 0) {
    key = &((files->d).ptr)->absolutePath;
    lVar8 = lVar8 * 0x30;
    do {
      this = (usedDependencies->q_hash).d;
      if ((this == (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) ||
         (pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::
                   findNode<QString>(this,key), pNVar6 == (Node<QString,_QHashDummyValue> *)0x0)) {
        QVar9.m_data = (char *)0x3;
        QVar9.m_size = (qsizetype)key;
        cVar4 = QString::endsWith(QVar9,0x1463ac);
        if ((cVar4 == '\0') ||
           (bVar5 = readDependenciesFromElf(options,key,usedDependencies,remainingDependencies),
           pFVar3 = _stdout, bVar5)) {
          QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QString,QHashDummyValue> *)usedDependencies,key,
                     (QHashDummyValue *)&local_50);
          pFVar3 = _stdout;
          if (options->verbose == true) {
            QString::toLocal8Bit_helper
                      ((QChar *)&local_50,
                       (longlong)(((QtDependency *)(key + -1))->relativePath).d.ptr);
            puVar7 = (undefined8 *)local_50.iterator.i.bucket;
            if ((undefined8 *)local_50.iterator.i.bucket == (undefined8 *)0x0) {
              puVar7 = &QByteArray::_empty;
            }
            fprintf(pFVar3,"Appending file dependency: %s\n",puVar7);
            if (local_50.iterator.i.d !=
                (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
              LOCK();
              ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                   ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate((QArrayData *)local_50.iterator.i.d,1,0x10);
              }
            }
          }
          QHash<QString,QList<QtDependency>>::tryEmplace_impl<QString_const&>
                    (&local_50,&options->qtDependencies,&options->currentArchitecture);
          pEVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
          bVar1 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                  [(uint)local_50.iterator.i.bucket & 0x7f];
          this_00 = (pEVar2->storage).data + (ulong)((uint)bVar1 * 0x30) + 0x18;
          QtPrivate::QGenericArrayOps<QtDependency>::emplace<QtDependency_const&>
                    ((QGenericArrayOps<QtDependency> *)this_00,
                     *(qsizetype *)((pEVar2->storage).data + (ulong)((uint)bVar1 * 0x30) + 0x28),
                     (QtDependency *)(key + -1));
          QList<QtDependency>::end((QList<QtDependency> *)this_00);
        }
        else {
          QString::toLocal8Bit_helper
                    ((QChar *)&local_50,(longlong)(((QtDependency *)(key + -1))->relativePath).d.ptr
                    );
          puVar7 = (undefined8 *)local_50.iterator.i.bucket;
          if ((undefined8 *)local_50.iterator.i.bucket == (undefined8 *)0x0) {
            puVar7 = &QByteArray::_empty;
          }
          fprintf(pFVar3,"Skipping file dependency: %s\n",puVar7);
          if (local_50.iterator.i.d !=
              (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
            LOCK();
            ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                 ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_50.iterator.i.d,1,0x10);
            }
          }
        }
      }
      key = key + 2;
      lVar8 = lVar8 + -0x30;
    } while (lVar8 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void readDependenciesFromFiles(Options *options, const QList<QtDependency> &files,
                               QSet<QString> &usedDependencies,
                               QSet<QString> &remainingDependencies)
{
    for (const QtDependency &fileName : files) {
        if (usedDependencies.contains(fileName.absolutePath))
            continue;

        if (fileName.absolutePath.endsWith(".so"_L1)) {
            if (!readDependenciesFromElf(options, fileName.absolutePath, &usedDependencies,
                                         &remainingDependencies)) {
                fprintf(stdout, "Skipping file dependency: %s\n",
                        qPrintable(fileName.relativePath));
                continue;
            }
        }
        usedDependencies.insert(fileName.absolutePath);

        if (options->verbose) {
            fprintf(stdout, "Appending file dependency: %s\n", qPrintable(fileName.relativePath));
        }

        options->qtDependencies[options->currentArchitecture].append(fileName);
    }
}